

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

ByteString * __thiscall
ByteString::substr(ByteString *__return_storage_ptr__,ByteString *this,size_t start,size_t len)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->byteString).
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  uVar3 = uVar2 - start;
  if (uVar2 < start || uVar3 == 0) {
    __return_storage_ptr__->_vptr_ByteString = (_func_int **)&PTR__ByteString_0019e890;
    (__return_storage_ptr__->byteString).
    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->byteString).
    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->byteString).
    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->byteString).
    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.super__Tp_alloc_type.
    _vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_0019e8c8;
  }
  else {
    if (uVar3 < len) {
      len = uVar3;
    }
    ByteString(__return_storage_ptr__,puVar1 + start,len);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString ByteString::substr(const size_t start, const size_t len /* = SIZE_T_MAX */) const
{
	size_t retLen = std::min(len, byteString.size() - start);

	if (start >= byteString.size())
	{
		return ByteString();
	}
	else
	{
		return ByteString(&byteString[start], retLen);
	}
}